

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

GCtab * newtab(lua_State *L,uint32_t asize,uint32_t hbits)

{
  GCtab *pGVar1;
  uint64_t uVar2;
  void *pvVar3;
  uint uVar4;
  
  if (asize - 1 < 0x10) {
    pGVar1 = (GCtab *)lj_mem_newgco(L,(ulong)(asize * 8 + 0x40));
    pGVar1->gct = '\v';
    pGVar1->nomm = 0xff;
    pGVar1->colo = (int8_t)asize;
    (pGVar1->array).ptr64 = (uint64_t)(pGVar1 + 1);
    (pGVar1->metatable).gcptr64 = 0;
    pGVar1->asize = asize;
    pGVar1->hmask = 0;
    uVar2 = (L->glref).ptr64 + 0xf8;
    (pGVar1->node).ptr64 = uVar2;
    (pGVar1->freetop).ptr64 = uVar2;
  }
  else {
    pGVar1 = (GCtab *)lj_mem_newgco(L,0x40);
    pGVar1->gct = '\v';
    pGVar1->nomm = 0xff;
    pGVar1->colo = '\0';
    (pGVar1->array).ptr64 = 0;
    (pGVar1->metatable).gcptr64 = 0;
    pGVar1->asize = 0;
    pGVar1->hmask = 0;
    uVar2 = (L->glref).ptr64 + 0xf8;
    (pGVar1->node).ptr64 = uVar2;
    (pGVar1->freetop).ptr64 = uVar2;
    if (asize != 0) {
      if (0x8000001 < asize) goto LAB_00125d10;
      pvVar3 = lj_mem_realloc(L,(void *)0x0,0,(ulong)(asize * 8));
      (pGVar1->array).ptr64 = (uint64_t)pvVar3;
      pGVar1->asize = asize;
    }
  }
  if (hbits != 0) {
    if (0x1a < hbits) {
LAB_00125d10:
      lj_err_msg(L,LJ_ERR_TABOV);
    }
    uVar4 = 1 << ((byte)hbits & 0x1f);
    pvVar3 = lj_mem_realloc(L,(void *)0x0,0,0x18L << ((byte)hbits & 0x3f));
    (pGVar1->node).ptr64 = (uint64_t)pvVar3;
    (pGVar1->freetop).ptr64 = (uint64_t)((ulong)uVar4 * 0x18 + (long)pvVar3);
    pGVar1->hmask = uVar4 - 1;
  }
  return pGVar1;
}

Assistant:

static GCtab *newtab(lua_State *L, uint32_t asize, uint32_t hbits)
{
  GCtab *t;
  /* First try to colocate the array part. */
  if (LJ_MAX_COLOSIZE != 0 && asize > 0 && asize <= LJ_MAX_COLOSIZE) {
    Node *nilnode;
    lj_assertL((sizeof(GCtab) & 7) == 0, "bad GCtab size");
    t = (GCtab *)lj_mem_newgco(L, sizetabcolo(asize));
    t->gct = ~LJ_TTAB;
    t->nomm = (uint8_t)~0;
    t->colo = (int8_t)asize;
    setmref(t->array, (TValue *)((char *)t + sizeof(GCtab)));
    setgcrefnull(t->metatable);
    t->asize = asize;
    t->hmask = 0;
    nilnode = &G(L)->nilnode;
    setmref(t->node, nilnode);
#if LJ_GC64
    setmref(t->freetop, nilnode);
#endif
  } else {  /* Otherwise separately allocate the array part. */
    Node *nilnode;
    t = lj_mem_newobj(L, GCtab);
    t->gct = ~LJ_TTAB;
    t->nomm = (uint8_t)~0;
    t->colo = 0;
    setmref(t->array, NULL);
    setgcrefnull(t->metatable);
    t->asize = 0;  /* In case the array allocation fails. */
    t->hmask = 0;
    nilnode = &G(L)->nilnode;
    setmref(t->node, nilnode);
#if LJ_GC64
    setmref(t->freetop, nilnode);
#endif
    if (asize > 0) {
      if (asize > LJ_MAX_ASIZE)
	lj_err_msg(L, LJ_ERR_TABOV);
      setmref(t->array, lj_mem_newvec(L, asize, TValue));
      t->asize = asize;
    }
  }
  if (hbits)
    newhpart(L, t, hbits);
  return t;
}